

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

string * __thiscall Json::Value::asString_abi_cxx11_(Value *this)

{
  char *pcVar1;
  byte *in_RSI;
  string *in_RDI;
  ostringstream oss;
  char *this_str;
  uint this_len;
  char **in_stack_fffffffffffffdc8;
  ostringstream *this_00;
  uint *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  allocator *paVar2;
  string *in_stack_fffffffffffffde0;
  double in_stack_fffffffffffffe28;
  ostringstream local_1b8 [382];
  allocator local_3a;
  allocator local_39;
  char *local_38;
  uint local_2c;
  allocator local_25 [20];
  allocator local_11 [17];
  
  switch(in_RSI[8]) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
    break;
  case 1:
    valueToString_abi_cxx11_((LargestInt)in_stack_fffffffffffffe28);
    break;
  case 2:
    valueToString_abi_cxx11_((LargestUInt)in_stack_fffffffffffffe28);
    break;
  case 3:
    valueToString_abi_cxx11_(in_stack_fffffffffffffe28);
    break;
  case 4:
    if (*(long *)in_RSI == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
    }
    else {
      decodePrefixedString
                (SUB81((ulong)in_stack_fffffffffffffde0 >> 0x38,0),in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,local_38,(ulong)local_2c,&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    break;
  case 5:
    pcVar1 = "false";
    if ((*in_RSI & 1) != 0) {
      pcVar1 = "true";
    }
    paVar2 = &local_3a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,paVar2);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  default:
    this_00 = local_1b8;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Type is not convertible to string");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffde0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    abort();
  }
  return in_RDI;
}

Assistant:

std::string Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
  {
    if (value_.string_ == 0) return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    return std::string(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}